

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall Buffer_commit_space_Test::TestBody(Buffer_commit_space_Test *this)

{
  size_t *__cont;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  size_t __dest;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  const_pointer __src;
  bfy_buffer *buf_00;
  AssertHelper local_218;
  Message local_210;
  string local_208;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_6;
  Message local_1d0;
  size_t local_1c8;
  unsigned_long local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_5;
  Message local_1a0;
  size_t local_198;
  size_type local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_4;
  Message local_170;
  int local_168 [2];
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  size_type local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  void *local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  size_t precommit_space;
  bfy_iovec io;
  string_view str;
  Message local_d0 [3];
  size_t local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  bfy_buffer buf;
  Buffer_commit_space_Test *this_local;
  
  bfy_buffer_init();
  local_ac = 0;
  local_b8 = bfy_buffer_get_content_len((bfy_buffer *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a8,"0","bfy_buffer_get_content_len(&buf)",&local_ac,&local_b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&str._M_str,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x429,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&str._M_str,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str._M_str);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  io.iov_len = 0x1a;
  str._M_len = (size_t)anon_var_dwarf_11aa1;
  sVar4 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)&io.iov_len);
  _precommit_space = bfy_buffer_reserve_space((bfy_buffer *)&gtest_ar.message_,sVar4);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )bfy_buffer_get_space_len((bfy_buffer *)&gtest_ar.message_);
  local_118 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((internal *)local_110,"nullptr","io.iov_base",&local_118,(void **)&precommit_space);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x42f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_140 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)&io.iov_len);
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)local_138,"std::size(str)","io.iov_len",&local_140,(unsigned_long *)&io);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar2) {
    testing::Message::Message(&local_148);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x430,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  __dest = precommit_space;
  __cont = &io.iov_len;
  __src = std::data<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)__cont);
  sVar4 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)__cont);
  memcpy((void *)__dest,__src,sVar4);
  local_168[1] = 0;
  sVar4 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)__cont);
  local_168[0] = bfy_buffer_commit_space((bfy_buffer *)&gtest_ar.message_,sVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_160,"0","bfy_buffer_commit_space(&buf, std::size(str))",local_168 + 1
             ,local_168);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x434,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_190 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)&io.iov_len);
  local_198 = bfy_buffer_get_content_len((bfy_buffer *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_188,"std::size(str)","bfy_buffer_get_content_len(&buf)",&local_190,
             &local_198);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x437,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  uVar1 = gtest_ar_1.message_;
  sVar4 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)&io.iov_len);
  local_1c0 = (long)uVar1._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl - sVar4;
  local_1c8 = bfy_buffer_get_space_len((bfy_buffer *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1b8,"precommit_space - std::size(str)",
             "bfy_buffer_get_space_len(&buf)",&local_1c0,&local_1c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar2) {
    testing::Message::Message(&local_1d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x438,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  (anonymous_namespace)::buffer_remove_string_abi_cxx11_
            (&local_208,(_anonymous_namespace_ *)&gtest_ar.message_,buf_00);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1e8,"str","buffer_remove_string(&buf)",
             (basic_string_view<char,_std::char_traits<char>_> *)&io.iov_len,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar2) {
    testing::Message::Message(&local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x439,pcVar3);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  bfy_buffer_destruct((bfy_buffer *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Buffer, commit_space) {
    // setup pt 1: create a buffer
    auto buf = bfy_buffer_init();
    EXPECT_EQ(0, bfy_buffer_get_content_len(&buf));

    // setup pt 2: reserve space and write into it
    auto constexpr str = std::string_view { "Lorem ipsum dolor sit amet" };
    auto const io = bfy_buffer_reserve_space(&buf, std::size(str));
    auto const precommit_space = bfy_buffer_get_space_len(&buf);
    EXPECT_NE(nullptr, io.iov_base);
    EXPECT_LE(std::size(str), io.iov_len);
    memcpy(io.iov_base, std::data(str), std::size(str));

    // confirm that the space can be committed
    EXPECT_EQ(0, bfy_buffer_commit_space(&buf, std::size(str)));

    // confirm that the committed space is now readable content
    EXPECT_EQ(std::size(str), bfy_buffer_get_content_len(&buf));
    EXPECT_EQ(precommit_space - std::size(str), bfy_buffer_get_space_len(&buf));
    EXPECT_EQ(str, buffer_remove_string(&buf));

    bfy_buffer_destruct(&buf);
}